

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrientationError.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::OrientationError::Encode(OrientationError *this,KDataStream *stream)

{
  (*(this->m_AziErr).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_AziErr);
  (*(this->m_ElvErr).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_ElvErr,stream);
  (*(this->m_RotErr).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_RotErr,stream);
  return;
}

Assistant:

void OrientationError::Encode( KDataStream & stream ) const
{
    stream << KDIS_STREAM m_AziErr
           << KDIS_STREAM m_ElvErr
           << KDIS_STREAM m_RotErr;
}